

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O3

void __thiscall CTcMake::set_compiler_options(CTcMake *this)

{
  ulong uVar1;
  CTcMakeDef *pCVar2;
  size_t sVar3;
  CTcTokenizer *this_00;
  CTcMain *pCVar4;
  int iVar5;
  size_t len;
  ulong uVar6;
  char *expansion;
  char *pcVar7;
  CTcMakePath *pCVar8;
  char buf [256];
  char acStack_128 [256];
  
  pCVar4 = G_tcmain;
  uVar6 = (ulong)(this->verbose_ != 0);
  uVar1 = G_tcmain->err_options_;
  G_tcmain->err_options_ = uVar6 | uVar1 & 0xfffffffffffffffe;
  uVar1 = (uVar6 | uVar1 & 0xfffffffffffffffc) + (ulong)(this->show_err_numbers_ != 0) * 2;
  pCVar4->err_options_ = uVar1;
  uVar1 = (uVar1 & 0xfffffffffffffff7) + (ulong)(this->pedantic_ != 0) * 8;
  pCVar4->err_options_ = uVar1;
  sVar3 = this->suppress_cnt_;
  pCVar4->suppress_list_ = this->suppress_list_;
  pCVar4->suppress_cnt_ = sVar3;
  uVar1 = (uVar1 & 0xfffffffffffffffb) + (ulong)(this->show_warnings_ != 0) * 4;
  pCVar4->err_options_ = uVar1;
  uVar6 = (ulong)(this->test_report_mode_ != 0) << 4;
  pCVar4->err_options_ = uVar6 | uVar1 & 0xffffffffffffffef;
  pCVar4->err_options_ =
       (ulong)(this->quoted_fname_mode_ != 0) << 5 | uVar6 | uVar1 & 0xffffffffffffffcf;
  iVar5 = this->debug_;
  pCVar8 = this->inc_head_;
  G_debug = iVar5;
  if (pCVar8 != (CTcMakePath *)0x0) {
    do {
      pcVar7 = (pCVar8->path_).buf_;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "";
      }
      CTcTokenizer::add_inc_path(G_tok,pcVar7);
      pCVar8 = pCVar8->nxt_;
    } while (pCVar8 != (CTcMakePath *)0x0);
    iVar5 = this->debug_;
  }
  if (iVar5 != 0) {
    CTcTokenizer::add_define(G_tok,"__DEBUG","1");
  }
  if (this->test_report_mode_ != 0) {
    *(byte *)G_tok = *(byte *)G_tok | 8;
  }
  sprintf(acStack_128,"__TADS_SYS_%s","POSIX_UNIX_MSWINDOWS");
  CTcTokenizer::add_define(G_tok,acStack_128,"1");
  sprintf(acStack_128,"\'%s\'","POSIX_UNIX_MSWINDOWS");
  CTcTokenizer::add_define(G_tok,"__TADS_SYSTEM_NAME",acStack_128);
  sprintf(acStack_128,"%d",3);
  CTcTokenizer::add_define(G_tok,"__TADS_VERSION_MAJOR",acStack_128);
  sprintf(acStack_128,"%d",1);
  CTcTokenizer::add_define(G_tok,"__TADS_VERSION_MINOR",acStack_128);
  sprintf(acStack_128,"%d",1);
  CTcTokenizer::add_define(G_tok,"__TADS_MACRO_FORMAT_VERSION",acStack_128);
  CTcTokenizer::add_define(G_tok,"__TADS3","1");
  this_00 = G_tok;
  for (pCVar2 = this->def_head_; pCVar2 != (CTcMakeDef *)0x0; pCVar2 = pCVar2->nxt_) {
    pcVar7 = (pCVar2->sym_).buf_;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = "";
    }
    G_tok = this_00;
    if ((pCVar2->field_0x18 & 1) == 0) {
      len = strlen(pcVar7);
      CTcTokenizer::undefine(this_00,pcVar7,len);
    }
    else {
      expansion = (pCVar2->expan_).buf_;
      if (expansion == (char *)0x0) {
        expansion = "";
      }
      CTcTokenizer::add_define(this_00,pcVar7,expansion);
    }
    this_00 = G_tok;
  }
  G_tok = this_00;
  return;
}

Assistant:

void CTcMake::set_compiler_options()
{
    CTcMakePath *inc;
    CTcMakeDef *def;
    char buf[256];
    
    /* set the error verbosity and warning level modes */
    G_tcmain->set_verbosity(verbose_);
    G_tcmain->set_show_err_numbers(show_err_numbers_);
    G_tcmain->set_pedantic(pedantic_);
    G_tcmain->set_suppress_list(suppress_list_, suppress_cnt_);
    G_tcmain->set_warnings(show_warnings_);
    G_tcmain->set_test_report_mode(test_report_mode_);
    G_tcmain->set_quote_filenames(quoted_fname_mode_);

    /* set debug mode */
    G_debug = debug_;

    /* add the #include path entries */
    for (inc = inc_head_ ; inc != 0 ; inc = inc->get_next())
        G_tok->add_inc_path(inc->get_path());

    /* if we're in debug mode, add the __DEBUG pre-defined macro */
    if (debug_)
        G_tok->add_define("__DEBUG", "1");

    /* 
     *   if we're in test report mode, generate __FILE__ expansions with
     *   root names only 
     */
    if (test_report_mode_)
        G_tok->set_test_report_mode(TRUE);

    /* add the system-name pre-defined macro */
    sprintf(buf, "__TADS_SYS_%s", OS_SYSTEM_NAME);
    G_tok->add_define(buf, "1");

    /* add the pre-defined macro expanding to the system name */
    sprintf(buf, "'%s'", OS_SYSTEM_NAME);
    G_tok->add_define("__TADS_SYSTEM_NAME", buf);

    /* add the major and minor version number macros */
    sprintf(buf, "%d", TC_VSN_MAJOR);
    G_tok->add_define("__TADS_VERSION_MAJOR", buf);
    sprintf(buf, "%d", TC_VSN_MINOR);
    G_tok->add_define("__TADS_VERSION_MINOR", buf);

    /* add the preprocess macro format version number */
    sprintf(buf, "%d", TCTOK_MACRO_FORMAT_VERSION);
    G_tok->add_define("__TADS_MACRO_FORMAT_VERSION", buf);

    /* add a symbol for __TADS3 */
    G_tok->add_define("__TADS3", "1");

    /* add the preprocessor symbol definitions */
    for (def = def_head_ ; def != 0 ; def = def->get_next())
    {
        /* define or undefine the symbol as appropriate */
        if (def->is_def())
            G_tok->add_define(def->get_sym(), def->get_expan());
        else
            G_tok->undefine(def->get_sym());
    }
}